

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.cpp
# Opt level: O0

vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
* __thiscall
json::JsonObject::sort_abi_cxx11_
          (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
           *__return_storage_ptr__,JsonObject *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  bool bVar1;
  size_type sVar2;
  iterator iVar3;
  iterator iVar4;
  reference ppVar5;
  type __args_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>
  *pair_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  *__range1_1;
  Value *local_70;
  reference local_68;
  reference local_60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>
  *pair;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>_>_>
  *__range1;
  undefined1 local_30 [8];
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  temp;
  JsonObject *this_local;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
  *result;
  
  temp.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  ::vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
            *)local_30);
  sVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>_>_>
          ::size(&this->children);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  ::reserve((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
             *)local_30,sVar2);
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>_>_>
           ::begin(&this->children);
  pair = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>
          *)std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>_>_>
            ::end(&this->children);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>,_true>
                              *)&pair), bVar1) {
    local_68 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>,_false,_true>
               ::operator*(&__end1);
    local_70 = &local_68->second;
    local_60 = local_68;
    std::
    vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>
    ::emplace_back<std::__cxx11::string_const*,json::JsonObject::Value*>
              ((vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>
                *)local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_68,
               &local_70);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>,_false,_true>
    ::operator++(&__end1);
  }
  iVar3 = std::
          vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
          ::begin((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
                   *)local_30);
  iVar4 = std::
          vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
          ::end((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
                 *)local_30);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>*,std::vector<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>,std::allocator<std::pair<std::__cxx11::string_const*,json::JsonObject::Value*>>>>,json::JsonObject::sort()::__0>
            (iVar3._M_current,iVar4._M_current);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
  ::vector(__return_storage_ptr__);
  sVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>_>_>
          ::size(&this->children);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_json::JsonNode_&>_>_>
  ::reserve(__return_storage_ptr__,sVar2);
  __end1_1 = std::
             vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
             ::begin((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
                      *)local_30);
  pair_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>
            *)std::
              vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
              ::end((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
                     *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>_>
                             *)&pair_1), bVar1) {
    ppVar5 = __gnu_cxx::
             __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>_>
             ::operator*(&__end1_1);
    __args = ppVar5->first;
    __args_1 = std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::operator*
                         (&ppVar5->second->node);
    std::
    vector<std::pair<std::__cxx11::string_const&,json::JsonNode&>,std::allocator<std::pair<std::__cxx11::string_const&,json::JsonNode&>>>
    ::emplace_back<std::__cxx11::string_const&,json::JsonNode&>
              ((vector<std::pair<std::__cxx11::string_const&,json::JsonNode&>,std::allocator<std::pair<std::__cxx11::string_const&,json::JsonNode&>>>
                *)__return_storage_ptr__,__args,__args_1);
    __gnu_cxx::
    __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
  ::~vector((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_json::JsonObject::Value_*>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<const std::string &, JsonNode &>> JsonObject::sort()
    {
        // Create a new vector and reserve enough space.
        std::vector<std::pair<const std::string *, Value *>> temp;
        temp.reserve(children.size());

        // Fill up the array.
        for (auto &pair : children)
            temp.emplace_back(&pair.first, &pair.second);

        // Sort the array based on the insertion order.
        std::sort(temp.begin(), temp.end(), [](const std::pair<const std::string *, Value *> &left, const std::pair<const std::string *, Value *> &right) {
            return left.second->orderIndex < right.second->orderIndex;
        });

        // We don't want to return a vector of std::pair<const std::string *, Value*>
        // therefore we create a new vector of the type we want to return.
        std::vector<std::pair<const std::string &, JsonNode &>> result;
        result.reserve(children.size());

        for (auto &pair : temp)
            result.emplace_back(*pair.first, *pair.second->node);

        return result;
    }